

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_get_diag(Integer s_a,Integer *g_d)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  Integer iproc_00;
  Integer IVar8;
  void *__ptr;
  Integer IVar9;
  undefined8 *puVar10;
  Integer *in_RSI;
  long in_RDI;
  char op [2];
  void *vptr;
  void *diag;
  Integer j;
  Integer i;
  int idx_size;
  int64_t *jlptr;
  int64_t *ilptr;
  int *jptr;
  int *iptr;
  Integer ncols;
  Integer jhi;
  Integer jlo;
  Integer ihi;
  Integer ilo;
  Integer hi;
  Integer lo;
  Integer one;
  Integer iproc;
  Integer nproc;
  Integer me;
  Integer grp;
  Integer *map;
  int local_sync_end;
  int local_sync_begin;
  Integer hdl;
  Integer *in_stack_00000238;
  Integer *in_stack_00000240;
  Integer in_stack_00000248;
  Integer in_stack_00000250;
  Integer *in_stack_00000310;
  void *in_stack_00000318;
  Integer *in_stack_00000320;
  Integer *in_stack_00000328;
  Integer in_stack_00000330;
  Integer in_stack_00000490;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 uVar11;
  undefined1 uVar12;
  char *in_stack_ffffffffffffff30;
  long in_stack_ffffffffffffff38;
  Integer *in_stack_ffffffffffffff40;
  long lVar13;
  long lVar14;
  Integer *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  Integer *in_stack_ffffffffffffff58;
  long in_stack_ffffffffffffff60;
  long local_98;
  long local_90;
  Integer local_80;
  Integer local_78;
  long local_70;
  long local_68;
  void *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  void *idx;
  long lVar15;
  
  lVar7 = in_RDI + 1000;
  IVar8 = SPA[lVar7].grp;
  iproc_00 = pnga_pgroup_nodeid(IVar8);
  IVar8 = pnga_pgroup_nnodes(IVar8);
  iVar5 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  idx = (void *)0x1;
  iVar6 = (int)SPA[lVar7].idx_size;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar1 != 0) {
    pnga_pgroup_sync((Integer)in_stack_ffffffffffffff30);
  }
  __ptr = malloc((IVar8 + 1) * 8);
  for (lVar15 = 0; lVar15 < IVar8 + 1; lVar15 = lVar15 + 1) {
    *(undefined8 *)((long)__ptr + lVar15 * 8) = 0;
  }
  *(Integer *)((long)__ptr + iproc_00 * 8) = SPA[lVar7].ilo + 1;
  if (iproc_00 == IVar8 + -1) {
    *(Integer *)((long)__ptr + iproc_00 * 8 + 8) = SPA[lVar7].ihi + 1;
  }
  uVar11 = 0x2b;
  uVar12 = 0;
  pnga_pgroup_gop(CONCAT44(iVar6,in_stack_ffffffffffffff50),(Integer)in_stack_ffffffffffffff48,
                  in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  IVar9 = pnga_create_handle();
  *in_RSI = IVar9;
  pnga_set_data(CONCAT44(iVar6,in_stack_ffffffffffffff50),(Integer)in_stack_ffffffffffffff48,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pnga_set_pgroup((Integer)in_stack_ffffffffffffff30,
                  CONCAT17(uVar12,CONCAT16(uVar11,in_stack_ffffffffffffff28)));
  pnga_set_irreg_distr
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (Integer *)CONCAT44(iVar6,in_stack_ffffffffffffff50));
  pnga_allocate(in_stack_00000490);
  pnga_zero(ncols);
  pnga_distribution(in_stack_00000250,in_stack_00000248,in_stack_00000240,in_stack_00000238);
  pnga_access_ptr(in_stack_00000330,in_stack_00000328,in_stack_00000320,in_stack_00000318,
                  in_stack_00000310);
  pnga_sprs_array_row_distribution
            (in_stack_ffffffffffffff60,(Integer)in_stack_ffffffffffffff58,
             (Integer *)CONCAT44(iVar6,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
  pnga_sprs_array_column_distribution(in_RDI,iproc_00,&local_78,&local_80);
  if (iVar6 == 4) {
    pnga_sprs_array_access_col_block
              (IVar8,lVar15,idx,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    for (lVar15 = local_68; lVar15 <= local_70; lVar15 = lVar15 + 1) {
      iVar1 = *(int *)(local_90 + ((lVar15 + 1) - local_68) * 4);
      iVar6 = *(int *)(local_90 + (lVar15 - local_68) * 4);
      for (lVar13 = 0; lVar13 < iVar1 - iVar6; lVar13 = lVar13 + 1) {
        if (lVar15 == *(int *)(local_98 +
                              (*(int *)(local_90 + (lVar15 - local_68) * 4) + lVar13) * 4)) {
          if (SPA[lVar7].type == 0x3e9) {
            *(undefined4 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 4) =
                 *(undefined4 *)
                  (in_stack_ffffffffffffff30 +
                  (*(int *)(local_90 + (lVar15 - local_68) * 4) + lVar13) * 4);
          }
          else if (SPA[lVar7].type == 0x3ea) {
            *(undefined8 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 8) =
                 *(undefined8 *)
                  (in_stack_ffffffffffffff30 +
                  (*(int *)(local_90 + (lVar15 - local_68) * 4) + lVar13) * 8);
          }
          else if (SPA[lVar7].type == 0x3f8) {
            *(undefined8 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 8) =
                 *(undefined8 *)
                  (in_stack_ffffffffffffff30 +
                  (*(int *)(local_90 + (lVar15 - local_68) * 4) + lVar13) * 8);
          }
          else if (SPA[lVar7].type == 0x3eb) {
            *(undefined4 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 4) =
                 *(undefined4 *)
                  (in_stack_ffffffffffffff30 +
                  (*(int *)(local_90 + (lVar15 - local_68) * 4) + lVar13) * 4);
          }
          else if (SPA[lVar7].type == 0x3ec) {
            *(undefined8 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 8) =
                 *(undefined8 *)
                  (in_stack_ffffffffffffff30 +
                  (*(int *)(local_90 + (lVar15 - local_68) * 4) + lVar13) * 8);
          }
          else if (SPA[lVar7].type == 0x3ee) {
            *(undefined8 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 8) =
                 *(undefined8 *)
                  (in_stack_ffffffffffffff30 +
                  (*(int *)(local_90 + (lVar15 - local_68) * 4) + lVar13) * 8);
          }
          else if (SPA[lVar7].type == 0x3ef) {
            puVar10 = (undefined8 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 0x10);
            iVar2 = *(int *)(local_90 + (lVar15 - local_68) * 4);
            *puVar10 = *(undefined8 *)(in_stack_ffffffffffffff30 + (iVar2 + lVar13) * 0x10);
            puVar10[1] = *(undefined8 *)(in_stack_ffffffffffffff30 + (iVar2 + lVar13) * 0x10 + 8);
          }
        }
      }
    }
  }
  else {
    pnga_sprs_array_access_col_block
              (IVar8,lVar15,idx,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    for (lVar15 = local_68; lVar15 <= local_70; lVar15 = lVar15 + 1) {
      lVar13 = *(long *)(in_stack_ffffffffffffff60 + ((lVar15 + 1) - local_68) * 8);
      lVar3 = *(long *)(in_stack_ffffffffffffff60 + (lVar15 - local_68) * 8);
      for (lVar14 = 0; lVar14 < lVar13 - lVar3; lVar14 = lVar14 + 1) {
        if (lVar15 == in_stack_ffffffffffffff58
                      [*(long *)(in_stack_ffffffffffffff60 + (lVar15 - local_68) * 8) + lVar14]) {
          if (SPA[lVar7].type == 0x3e9) {
            *(undefined4 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 4) =
                 *(undefined4 *)
                  (in_stack_ffffffffffffff30 +
                  (*(long *)(in_stack_ffffffffffffff60 + (lVar15 - local_68) * 8) + lVar14) * 4);
          }
          else if (SPA[lVar7].type == 0x3ea) {
            *(undefined8 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 8) =
                 *(undefined8 *)
                  (in_stack_ffffffffffffff30 +
                  (*(long *)(in_stack_ffffffffffffff60 + (lVar15 - local_68) * 8) + lVar14) * 8);
          }
          else if (SPA[lVar7].type == 0x3f8) {
            *(undefined8 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 8) =
                 *(undefined8 *)
                  (in_stack_ffffffffffffff30 +
                  (*(long *)(in_stack_ffffffffffffff60 + (lVar15 - local_68) * 8) + lVar14) * 8);
          }
          else if (SPA[lVar7].type == 0x3eb) {
            *(undefined4 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 4) =
                 *(undefined4 *)
                  (in_stack_ffffffffffffff30 +
                  (*(long *)(in_stack_ffffffffffffff60 + (lVar15 - local_68) * 8) + lVar14) * 4);
          }
          else if (SPA[lVar7].type == 0x3ec) {
            *(undefined8 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 8) =
                 *(undefined8 *)
                  (in_stack_ffffffffffffff30 +
                  (*(long *)(in_stack_ffffffffffffff60 + (lVar15 - local_68) * 8) + lVar14) * 8);
          }
          else if (SPA[lVar7].type == 0x3ee) {
            *(undefined8 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 8) =
                 *(undefined8 *)
                  (in_stack_ffffffffffffff30 +
                  (*(long *)(in_stack_ffffffffffffff60 + (lVar15 - local_68) * 8) + lVar14) * 8);
          }
          else if (SPA[lVar7].type == 0x3ef) {
            puVar10 = (undefined8 *)(in_stack_ffffffffffffff38 + (lVar15 - local_68) * 0x10);
            lVar4 = *(long *)(in_stack_ffffffffffffff60 + (lVar15 - local_68) * 8);
            *puVar10 = *(undefined8 *)(in_stack_ffffffffffffff30 + (lVar4 + lVar14) * 0x10);
            puVar10[1] = *(undefined8 *)(in_stack_ffffffffffffff30 + (lVar4 + lVar14) * 0x10 + 8);
          }
        }
      }
    }
  }
  free(__ptr);
  pnga_release_update(*in_RSI,(Integer *)&stack0xffffffffffffffa8,
                      (Integer *)&stack0xffffffffffffffa0);
  if (iVar5 != 0) {
    pnga_pgroup_sync((Integer)in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void pnga_sprs_array_get_diag(Integer s_a, Integer *g_d)
{
  Integer hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer *map;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer iproc;
  Integer one = 1;
  Integer lo, hi;
  Integer ilo, ihi, jlo, jhi, ncols;
  int *iptr, *jptr;
  int64_t *ilptr, *jlptr;
  int idx_size = SPA[hdl].idx_size;
  Integer i, j;
  void *diag, *vptr;
  char op[2];


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);
  /* Get row distribution of matrix */
  map = (Integer*)malloc((nproc+1)*sizeof(Integer));
  for (iproc=0; iproc<nproc+1; iproc++) map[iproc] = 0;
  map[me] = SPA[hdl].ilo+1;
  if (me == nproc-1) map[me+1] = SPA[hdl].ihi+1;
  op[0] = '+';
  op[1] = '\0';
  if (sizeof(Integer) == 4) {
    pnga_pgroup_gop(grp, C_INT, map, nproc+1, op);
  } else {
    pnga_pgroup_gop(grp, C_LONG, map, nproc+1, op);
  }
  /* Create array to hold diagonal */
  *g_d = pnga_create_handle();
  pnga_set_data(*g_d,one,&SPA[hdl].idim,SPA[hdl].type);
  pnga_set_pgroup(*g_d,SPA[hdl].grp);
  pnga_set_irreg_distr(*g_d,map,&nproc);
  pnga_allocate(*g_d);
  /* zero all elements. If diagonal element is not found for a row, then it
   * must be zero */
  pnga_zero(*g_d);
  pnga_distribution(*g_d,me,&lo,&hi);
  pnga_access_ptr(*g_d, &lo, &hi, &diag, &one);
  /* extract diagonal elements */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  pnga_sprs_array_column_distribution(s_a,me,&jlo,&jhi);
  if (idx_size == 4) {
    pnga_sprs_array_access_col_block(s_a,me,&iptr,&jptr,&vptr);
    for (i=ilo; i<=ihi; i++) {
      ncols = iptr[i+1-ilo]-iptr[i-ilo];
      for (j=0; j<ncols; j++) {
        if (i == jptr[iptr[i-ilo]+j]) {
          if (SPA[hdl].type == C_INT) {
            ((int*)diag)[i-ilo] = ((int*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONG) {
            ((long*)diag)[i-ilo] = ((long*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONGLONG) {
            ((long long*)diag)[i-ilo] = ((long long*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_FLOAT) {
            ((float*)diag)[i-ilo] = ((float*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DBL) {
            ((double*)diag)[i-ilo] = ((double*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_SCPL) {
            ((SingleComplex*)diag)[i-ilo] = ((SingleComplex*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DCPL) {
            ((DoubleComplex*)diag)[i-ilo] = ((DoubleComplex*)vptr)[iptr[i-ilo]+j];
          }
        }
      }
    }
  } else {
    pnga_sprs_array_access_col_block(s_a,me,&ilptr,&jlptr,&vptr);
    for (i=ilo; i<=ihi; i++) {
      ncols = ilptr[i+1-ilo]-ilptr[i-ilo];
      for (j=0; j<ncols; j++) {
        if (i == jlptr[ilptr[i-ilo]+j]) {
          if (SPA[hdl].type == C_INT) {
            ((int*)diag)[i-ilo] = ((int*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONG) {
            ((long*)diag)[i-ilo] = ((long*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONGLONG) {
            ((long long*)diag)[i-ilo] = ((long long*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_FLOAT) {
            ((float*)diag)[i-ilo] = ((float*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DBL) {
            ((double*)diag)[i-ilo] = ((double*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_SCPL) {
            ((SingleComplex*)diag)[i-ilo] = ((SingleComplex*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DCPL) {
            ((DoubleComplex*)diag)[i-ilo] = ((DoubleComplex*)vptr)[ilptr[i-ilo]+j];
          }
        }
      }
    }
  }
  free(map);
  pnga_release_update(*g_d, &lo, &hi);
  if (local_sync_end) pnga_pgroup_sync(grp);
}